

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclDevice.cpp
# Opt level: O3

void __thiscall xmrig::OclDevice::toJSON(OclDevice *this,Value *out,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Document *doc_00;
  Data local_78;
  Data local_68;
  Data local_50;
  StringRefType local_40;
  
  allocator = doc->allocator_;
  doc_00 = (Document *)&this->m_board;
  if ((this->m_board).m_data == (char *)0x0) {
    doc_00 = (Document *)&this->m_name;
  }
  String::toJSON((String *)&local_78.s,doc_00);
  local_68.s.str = (Ch *)0x40500000018c305;
  local_68.n = (Number)0x5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(out,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_68.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,allocator);
  String::toJSON((String *)&local_78.s,(Document *)&this->m_name);
  local_68.s.str = (Ch *)0x40500000018c30b;
  local_68.n = (Number)0x4;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(out,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_68.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,allocator);
  PciTopology::toString((PciTopology *)&local_50.s);
  String::toJSON((String *)&local_78.s,(Document *)&local_50.s);
  local_68.s.str = (Ch *)0x40500000018c310;
  local_68.n = (Number)0x6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(out,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_68.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,allocator);
  if (local_50.n.i64 != 0) {
    operator_delete__((void *)local_50.n);
  }
  local_68._4_1_ = '\0';
  local_68._5_1_ = '\0';
  local_68._6_1_ = '\0';
  local_68._7_1_ = '\0';
  local_68._0_4_ = this->m_computeUnits;
  local_78.s.str = (Ch *)0x40500000018c317;
  local_78.n = (Number)0x2;
  local_68.s.str = (Ch *)((ulong)(-1 < (int)this->m_computeUnits) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(out,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_68.s,allocator);
  local_40.s = "global_mem";
  local_40.length = 10;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>(out,&local_40,this->m_globalMemory,allocator);
  return;
}

Assistant:

void xmrig::OclDevice::toJSON(rapidjson::Value &out, rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    out.AddMember("board",       board().toJSON(doc), allocator);
    out.AddMember("name",        name().toJSON(doc), allocator);
    out.AddMember("bus_id",      topology().toString().toJSON(doc), allocator);
    out.AddMember("cu",          computeUnits(), allocator);
    out.AddMember("global_mem",  static_cast<uint64_t>(globalMemSize()), allocator);
}